

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,GLenum _enumType,int _arraySize)

{
  int _arraySize_local;
  GLenum _enumType_local;
  UniformType *this_local;
  
  this->enumType = _enumType;
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented);
  this->arraySize = _arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes);
  std::__cxx11::string::string((string *)&this->strType);
  std::__cxx11::string::string((string *)&this->refStrType);
  std::pair<int,_int>::pair<int,_int,_true>(&this->size);
  this->isArray = 0 < _arraySize;
  this->signedType = true;
  if (this->arraySize == 0) {
    this->arraySize = 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,&this->arraySize);
  fill(this);
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}